

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O2

_Bool trans_VSEL(DisasContext_conflict1 *s,arg_VSEL *a)

{
  int iVar1;
  uint uVar2;
  int reg;
  int reg_00;
  int reg_01;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var3;
  TCGv_i64 c2;
  TCGv_i64 var;
  TCGv_i64 var_00;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 ret_01;
  TCGv_i64 ret_02;
  TCGv_i32 c2_00;
  TCGv_i32 var_01;
  TCGv_i32 var_02;
  TCGv_i32 ret_03;
  TCGv_i64 ret_04;
  TCGv_i32 ret_05;
  TCGv_i64 pTVar4;
  TCGv_i32 pTVar5;
  uintptr_t o_3;
  TCGCond TVar6;
  uintptr_t o;
  uintptr_t o_9;
  uintptr_t o_1;
  uintptr_t o_2;
  
  if ((s->isar->mvfr2 & 0xf0) == 0) {
    return false;
  }
  tcg_ctx = s->uc->tcg_ctx;
  iVar1 = a->dp;
  if (iVar1 != 0) {
    uVar2 = s->isar->mvfr0;
    if ((uVar2 & 0xf00) == 0) {
      return false;
    }
    if (((uVar2 & 0xe) == 0) && (((a->vn | a->vm | a->vd) & 0x10U) != 0)) {
      return false;
    }
  }
  reg = a->vd;
  reg_00 = a->vm;
  reg_01 = a->vn;
  _Var3 = vfp_access_check(s);
  if (!_Var3) {
    return true;
  }
  if (iVar1 == 0) {
    c2_00 = tcg_const_i32_aarch64(tcg_ctx,0);
    var_01 = tcg_temp_new_i32(tcg_ctx);
    var_02 = tcg_temp_new_i32(tcg_ctx);
    ret_03 = tcg_temp_new_i32(tcg_ctx);
    neon_load_reg32(tcg_ctx,var_01,reg_01);
    neon_load_reg32(tcg_ctx,var_02,reg_00);
    switch(a->cc) {
    case 0:
      pTVar5 = tcg_ctx->cpu_ZF;
      TVar6 = TCG_COND_EQ;
      break;
    case 1:
      pTVar5 = tcg_ctx->cpu_VF;
      TVar6 = TCG_COND_LT;
      break;
    case 2:
      ret_05 = tcg_temp_new_i32(tcg_ctx);
      tcg_gen_xor_i32(tcg_ctx,ret_05,tcg_ctx->cpu_VF,tcg_ctx->cpu_NF);
      pTVar5 = var_01;
      goto LAB_005edd82;
    case 3:
      tcg_gen_movcond_i32_aarch64(tcg_ctx,TCG_COND_NE,ret_03,tcg_ctx->cpu_ZF,c2_00,var_01,var_02);
      ret_05 = tcg_temp_new_i32(tcg_ctx);
      tcg_gen_xor_i32(tcg_ctx,ret_05,tcg_ctx->cpu_VF,tcg_ctx->cpu_NF);
      pTVar5 = ret_03;
LAB_005edd82:
      tcg_gen_movcond_i32_aarch64(tcg_ctx,TCG_COND_GE,ret_03,ret_05,c2_00,pTVar5,var_02);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_05 + (long)tcg_ctx));
    default:
      goto switchD_005edb76_default;
    }
    tcg_gen_movcond_i32_aarch64(tcg_ctx,TVar6,ret_03,pTVar5,c2_00,var_01,var_02);
switchD_005edb76_default:
    neon_store_reg32(tcg_ctx,ret_03,reg);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(var_01 + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(var_02 + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_03 + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(c2_00 + (long)tcg_ctx));
    return true;
  }
  c2 = tcg_const_i64_aarch64(tcg_ctx,0);
  var = tcg_temp_new_i64(tcg_ctx);
  var_00 = tcg_temp_new_i64(tcg_ctx);
  ret = tcg_temp_new_i64(tcg_ctx);
  ret_00 = tcg_temp_new_i64(tcg_ctx);
  ret_01 = tcg_temp_new_i64(tcg_ctx);
  ret_02 = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_extu_i32_i64_aarch64(tcg_ctx,ret_00,tcg_ctx->cpu_ZF);
  tcg_gen_ext_i32_i64_aarch64(tcg_ctx,ret_01,tcg_ctx->cpu_NF);
  tcg_gen_ext_i32_i64_aarch64(tcg_ctx,ret_02,tcg_ctx->cpu_VF);
  neon_load_reg64(tcg_ctx,var,reg_01);
  neon_load_reg64(tcg_ctx,var_00,reg_00);
  switch(a->cc) {
  case 0:
    TVar6 = TCG_COND_EQ;
    pTVar4 = ret_00;
    break;
  case 1:
    TVar6 = TCG_COND_LT;
    pTVar4 = ret_02;
    break;
  case 2:
    ret_04 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_xor_i64_aarch64(tcg_ctx,ret_04,ret_02,ret_01);
    pTVar4 = var;
    goto LAB_005edc22;
  case 3:
    tcg_gen_movcond_i64_aarch64(tcg_ctx,TCG_COND_NE,ret,ret_00,c2,var,var_00);
    ret_04 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_xor_i64_aarch64(tcg_ctx,ret_04,ret_02,ret_01);
    pTVar4 = ret;
LAB_005edc22:
    tcg_gen_movcond_i64_aarch64(tcg_ctx,TCG_COND_GE,ret,ret_04,c2,pTVar4,var_00);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_04 + (long)tcg_ctx));
  default:
    goto switchD_005edad7_default;
  }
  tcg_gen_movcond_i64_aarch64(tcg_ctx,TVar6,ret,pTVar4,c2,var,var_00);
switchD_005edad7_default:
  neon_store_reg64(tcg_ctx,ret,reg);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(var + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(var_00 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_01 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_02 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(c2 + (long)tcg_ctx));
  return true;
}

Assistant:

static bool trans_VSEL(DisasContext *s, arg_VSEL *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint32_t rd, rn, rm;
    bool dp = a->dp;

    if (!dc_isar_feature(aa32_vsel, s)) {
        return false;
    }

    if (dp && !dc_isar_feature(aa32_fpdp_v2, s)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist */
    if (dp && !dc_isar_feature(aa32_simd_r32, s) &&
        ((a->vm | a->vn | a->vd) & 0x10)) {
        return false;
    }

    rd = a->vd;
    rn = a->vn;
    rm = a->vm;

    if (!vfp_access_check(s)) {
        return true;
    }

    if (dp) {
        TCGv_i64 frn, frm, dest;
        TCGv_i64 tmp, zero, zf, nf, vf;

        zero = tcg_const_i64(tcg_ctx, 0);

        frn = tcg_temp_new_i64(tcg_ctx);
        frm = tcg_temp_new_i64(tcg_ctx);
        dest = tcg_temp_new_i64(tcg_ctx);

        zf = tcg_temp_new_i64(tcg_ctx);
        nf = tcg_temp_new_i64(tcg_ctx);
        vf = tcg_temp_new_i64(tcg_ctx);

        tcg_gen_extu_i32_i64(tcg_ctx, zf, tcg_ctx->cpu_ZF);
        tcg_gen_ext_i32_i64(tcg_ctx, nf, tcg_ctx->cpu_NF);
        tcg_gen_ext_i32_i64(tcg_ctx, vf, tcg_ctx->cpu_VF);

        neon_load_reg64(tcg_ctx, frn, rn);
        neon_load_reg64(tcg_ctx, frm, rm);
        switch (a->cc) {
        case 0: /* eq: Z */
            tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, dest, zf, zero,
                                frn, frm);
            break;
        case 1: /* vs: V */
            tcg_gen_movcond_i64(tcg_ctx, TCG_COND_LT, dest, vf, zero,
                                frn, frm);
            break;
        case 2: /* ge: N == V -> N ^ V == 0 */
            tmp = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_xor_i64(tcg_ctx, tmp, vf, nf);
            tcg_gen_movcond_i64(tcg_ctx, TCG_COND_GE, dest, tmp, zero,
                                frn, frm);
            tcg_temp_free_i64(tcg_ctx, tmp);
            break;
        case 3: /* gt: !Z && N == V */
            tcg_gen_movcond_i64(tcg_ctx, TCG_COND_NE, dest, zf, zero,
                                frn, frm);
            tmp = tcg_temp_new_i64(tcg_ctx);
            tcg_gen_xor_i64(tcg_ctx, tmp, vf, nf);
            tcg_gen_movcond_i64(tcg_ctx, TCG_COND_GE, dest, tmp, zero,
                                dest, frm);
            tcg_temp_free_i64(tcg_ctx, tmp);
            break;
        }
        neon_store_reg64(tcg_ctx, dest, rd);
        tcg_temp_free_i64(tcg_ctx, frn);
        tcg_temp_free_i64(tcg_ctx, frm);
        tcg_temp_free_i64(tcg_ctx, dest);  // qq

        tcg_temp_free_i64(tcg_ctx, zf);
        tcg_temp_free_i64(tcg_ctx, nf);
        tcg_temp_free_i64(tcg_ctx, vf);

        tcg_temp_free_i64(tcg_ctx, zero);
    } else {
        TCGv_i32 frn, frm, dest;
        TCGv_i32 tmp, zero;

        zero = tcg_const_i32(tcg_ctx, 0);

        frn = tcg_temp_new_i32(tcg_ctx);
        frm = tcg_temp_new_i32(tcg_ctx);
        dest = tcg_temp_new_i32(tcg_ctx);
        neon_load_reg32(tcg_ctx, frn, rn);
        neon_load_reg32(tcg_ctx, frm, rm);
        switch (a->cc) {
        case 0: /* eq: Z */
            tcg_gen_movcond_i32(tcg_ctx, TCG_COND_EQ, dest, tcg_ctx->cpu_ZF, zero,
                                frn, frm);
            break;
        case 1: /* vs: V */
            tcg_gen_movcond_i32(tcg_ctx, TCG_COND_LT, dest, tcg_ctx->cpu_VF, zero,
                                frn, frm);
            break;
        case 2: /* ge: N == V -> N ^ V == 0 */
            tmp = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_xor_i32(tcg_ctx, tmp, tcg_ctx->cpu_VF, tcg_ctx->cpu_NF);
            tcg_gen_movcond_i32(tcg_ctx, TCG_COND_GE, dest, tmp, zero,
                                frn, frm);
            tcg_temp_free_i32(tcg_ctx, tmp);
            break;
        case 3: /* gt: !Z && N == V */
            tcg_gen_movcond_i32(tcg_ctx, TCG_COND_NE, dest, tcg_ctx->cpu_ZF, zero,
                                frn, frm);
            tmp = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_xor_i32(tcg_ctx, tmp, tcg_ctx->cpu_VF, tcg_ctx->cpu_NF);
            tcg_gen_movcond_i32(tcg_ctx, TCG_COND_GE, dest, tmp, zero,
                                dest, frm);
            tcg_temp_free_i32(tcg_ctx, tmp);
            break;
        }
        neon_store_reg32(tcg_ctx, dest, rd);
        tcg_temp_free_i32(tcg_ctx, frn);
        tcg_temp_free_i32(tcg_ctx, frm);
        tcg_temp_free_i32(tcg_ctx, dest);

        tcg_temp_free_i32(tcg_ctx, zero);
    }

    return true;
}